

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::GenerateOutputMeshes_3DGS_MDL7
          (MDLImporter *this,IntGroupData_MDL7 *groupData,IntSplitGroupData_MDL7 *splitGroupData)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  pointer pIVar3;
  pointer paVar4;
  IntBone_MDL7 *pIVar5;
  vector<aiMesh*,std::allocator<aiMesh*>> *this_00;
  iterator __position;
  pointer pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  aiVector3D **ppaVar22;
  uint uVar23;
  aiMesh *paVar24;
  ulong *puVar25;
  aiFace *paVar26;
  aiVector3D *paVar27;
  uint *puVar28;
  long lVar29;
  Logger *this_01;
  aiBone **ppaVar30;
  aiBone *paVar31;
  aiVertexWeight *__s;
  aiFace *paVar32;
  ulong uVar33;
  const_iterator k;
  pointer pvVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  aiMesh *pcMesh;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  aaiVWeightList;
  aiMesh *local_498;
  aiVector3D **local_490;
  ulong local_488;
  IntSplitGroupData_MDL7 *local_480;
  IntSharedData_MDL7 *local_478;
  uint local_46c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_468;
  ulong local_448;
  char *local_440;
  uint local_434;
  undefined1 local_430 [1024];
  
  local_478 = splitGroupData->shared;
  if ((local_478->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_478->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_448 = (ulong)*(uint *)(this->mBuffer + 8);
    local_46c = *(uint *)(this->mBuffer + 8) - 1;
    uVar33 = 0;
    local_480 = splitGroupData;
    do {
      ppvVar1 = local_480->aiSplit;
      pvVar2 = ppvVar1[uVar33];
      if ((pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar24 = (aiMesh *)operator_new(0x520);
        paVar24->mPrimitiveTypes = 0;
        paVar24->mNumVertices = 0;
        paVar24->mNumFaces = 0;
        local_490 = &paVar24->mVertices;
        memset(local_490,0,0xcc);
        paVar24->mBones = (aiBone **)0x0;
        paVar24->mMaterialIndex = 0;
        (paVar24->mName).length = 0;
        (paVar24->mName).data[0] = '\0';
        memset((paVar24->mName).data + 1,0x1b,0x3ff);
        paVar24->mNumAnimMeshes = 0;
        paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar24->mMethod = 0;
        (paVar24->mAABB).mMin.x = 0.0;
        (paVar24->mAABB).mMin.y = 0.0;
        (paVar24->mAABB).mMin.z = 0.0;
        (paVar24->mAABB).mMax.x = 0.0;
        (paVar24->mAABB).mMax.y = 0.0;
        (paVar24->mAABB).mMax.z = 0.0;
        paVar24->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar24->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar24->mNumUVComponents[0] = 0;
        paVar24->mNumUVComponents[1] = 0;
        paVar24->mNumUVComponents[2] = 0;
        paVar24->mNumUVComponents[3] = 0;
        paVar24->mNumUVComponents[4] = 0;
        paVar24->mNumUVComponents[5] = 0;
        paVar24->mNumUVComponents[6] = 0;
        paVar24->mNumUVComponents[7] = 0;
        paVar24->mColors[0] = (aiColor4D *)0x0;
        paVar24->mColors[1] = (aiColor4D *)0x0;
        paVar24->mColors[2] = (aiColor4D *)0x0;
        paVar24->mColors[3] = (aiColor4D *)0x0;
        paVar24->mColors[4] = (aiColor4D *)0x0;
        paVar24->mColors[5] = (aiColor4D *)0x0;
        paVar24->mColors[6] = (aiColor4D *)0x0;
        paVar24->mColors[7] = (aiColor4D *)0x0;
        paVar24->mPrimitiveTypes = 4;
        paVar24->mMaterialIndex = (uint)uVar33;
        pvVar2 = ppvVar1[uVar33];
        uVar37 = (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        uVar35 = (uint)uVar37;
        paVar24->mNumFaces = uVar35;
        uVar37 = uVar37 & 0xffffffff;
        local_498 = paVar24;
        local_488 = uVar33;
        puVar25 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
        *puVar25 = uVar37;
        paVar26 = (aiFace *)(puVar25 + 1);
        if (uVar37 != 0) {
          paVar32 = paVar26;
          do {
            paVar32->mNumIndices = 0;
            paVar32->mIndices = (uint *)0x0;
            paVar32 = paVar32 + 1;
          } while (paVar32 != paVar26 + uVar37);
        }
        paVar24->mFaces = paVar26;
        uVar33 = (ulong)(uVar35 * 3);
        paVar24->mNumVertices = uVar35 * 3;
        paVar27 = (aiVector3D *)operator_new__(uVar33 * 0xc);
        if (uVar35 != 0) {
          memset(paVar27,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *local_490 = paVar27;
        paVar27 = (aiVector3D *)operator_new__(uVar33 * 0xc);
        if (uVar35 != 0) {
          memset(paVar27,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        uVar33 = local_488;
        paVar24->mNormals = paVar27;
        if ((groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar24->mNumUVComponents[0] = 2;
          uVar35 = paVar24->mNumVertices;
          uVar37 = (ulong)uVar35;
          local_490 = (aiVector3D **)(uVar37 * 0xc);
          paVar27 = (aiVector3D *)operator_new__((ulong)local_490);
          if (uVar35 != 0) {
            memset(paVar27,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar24->mTextureCoords[0] = paVar27;
          if ((groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            paVar24->mNumUVComponents[1] = 2;
            paVar27 = (aiVector3D *)operator_new__((ulong)local_490);
            if (uVar37 != 0) {
              memset(paVar27,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar24->mTextureCoords[1] = paVar27;
          }
        }
        if (local_498->mNumFaces != 0) {
          uVar37 = 0;
          uVar38 = 0;
          do {
            local_498->mFaces[uVar37].mNumIndices = 3;
            puVar28 = (uint *)operator_new__(0xc);
            local_498->mFaces[uVar37].mIndices = puVar28;
            uVar35 = (local_480->aiSplit[uVar33]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar37];
            pIVar3 = (groupData->pcFaces).
                     super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar29 = 0;
            do {
              uVar23 = pIVar3[uVar35].mIndices[lVar29];
              paVar4 = (groupData->vPositions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar27 = local_498->mVertices;
              uVar33 = uVar38 + lVar29 & 0xffffffff;
              paVar27[uVar33].z = paVar4[uVar23].z;
              paVar4 = paVar4 + uVar23;
              fVar7 = paVar4->y;
              paVar27 = paVar27 + uVar33;
              paVar27->x = paVar4->x;
              paVar27->y = fVar7;
              paVar4 = (groupData->vNormals).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar27 = local_498->mNormals;
              paVar27[uVar33].z = paVar4[uVar23].z;
              paVar4 = paVar4 + uVar23;
              fVar7 = paVar4->y;
              paVar27 = paVar27 + uVar33;
              paVar27->x = paVar4->x;
              paVar27->y = fVar7;
              paVar4 = (groupData->vTextureCoords1).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (paVar4 != (groupData->vTextureCoords1).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                paVar27 = local_498->mTextureCoords[0];
                paVar27[uVar33].z = paVar4[uVar23].z;
                fVar7 = paVar4[uVar23].y;
                paVar27 = paVar27 + uVar33;
                paVar27->x = paVar4[uVar23].x;
                paVar27->y = fVar7;
                paVar4 = (groupData->vTextureCoords2).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if (paVar4 != (groupData->vTextureCoords2).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  paVar27 = local_498->mTextureCoords[1];
                  paVar27[uVar33].z = paVar4[uVar23].z;
                  fVar7 = paVar4[uVar23].y;
                  paVar27 = paVar27 + uVar33;
                  paVar27->x = paVar4[uVar23].x;
                  paVar27->y = fVar7;
                }
              }
              local_498->mFaces[uVar37].mIndices[lVar29] = (uint)(uVar38 + lVar29);
              lVar29 = lVar29 + 1;
            } while (lVar29 != 3);
            uVar37 = uVar37 + 1;
            uVar38 = (ulong)((int)uVar38 + 3);
            uVar33 = local_488;
          } while (uVar37 < local_498->mNumFaces);
        }
        if ((groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::resize(&local_468,local_448);
          pvVar6 = local_468.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_498->mNumFaces != 0) {
            uVar37 = 0;
            iVar36 = 0;
            do {
              uVar38 = local_448;
              uVar35 = (local_480->aiSplit[uVar33]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar37];
              pIVar3 = (groupData->pcFaces).
                       super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar29 = 0;
              do {
                uVar23 = (groupData->aiBones).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[pIVar3[uVar35].mIndices[lVar29]];
                if (uVar23 != 0xffffffff) {
                  if ((uint)uVar38 <= uVar23) {
                    this_01 = DefaultLogger::get();
                    Logger::error(this_01,
                                  "Bone index overflow. The bone index of a vertex exceeds the allowed range. "
                                 );
                    uVar23 = local_46c;
                  }
                  local_434 = iVar36 + (int)lVar29;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>
                            (local_468.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar23,&local_434);
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              uVar37 = uVar37 + 1;
              iVar36 = iVar36 + 3;
              uVar33 = local_488;
              pvVar6 = local_468.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar37 < local_498->mNumFaces);
          }
          for (; pvVar34 = local_468.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start, paVar24 = local_498,
              pvVar6 != local_468.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pvVar6 = pvVar6 + 1) {
            if ((pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start !=
                (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              local_498->mNumBones = local_498->mNumBones + 1;
            }
          }
          ppaVar30 = (aiBone **)operator_new__((ulong)local_498->mNumBones << 3);
          paVar24->mBones = ppaVar30;
          if (pvVar34 !=
              local_468.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_490 = (aiVector3D **)0x0;
            do {
              if ((pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start !=
                  (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
                paVar31 = (aiBone *)operator_new(0x450);
                (paVar31->mName).length = 0;
                local_440 = (paVar31->mName).data;
                (paVar31->mName).data[0] = '\0';
                memset((paVar31->mName).data + 1,0x1b,0x3ff);
                ppaVar22 = local_490;
                paVar31->mNumWeights = 0;
                paVar31->mWeights = (aiVertexWeight *)0x0;
                (paVar31->mOffsetMatrix).a1 = 1.0;
                (paVar31->mOffsetMatrix).a2 = 0.0;
                (paVar31->mOffsetMatrix).a3 = 0.0;
                (paVar31->mOffsetMatrix).a4 = 0.0;
                (paVar31->mOffsetMatrix).b1 = 0.0;
                (paVar31->mOffsetMatrix).b2 = 1.0;
                (paVar31->mOffsetMatrix).b3 = 0.0;
                (paVar31->mOffsetMatrix).b4 = 0.0;
                (paVar31->mOffsetMatrix).c1 = 0.0;
                (paVar31->mOffsetMatrix).c2 = 0.0;
                (paVar31->mOffsetMatrix).c3 = 1.0;
                (paVar31->mOffsetMatrix).c4 = 0.0;
                (paVar31->mOffsetMatrix).d1 = 0.0;
                (paVar31->mOffsetMatrix).d2 = 0.0;
                (paVar31->mOffsetMatrix).d3 = 0.0;
                (paVar31->mOffsetMatrix).d4 = 1.0;
                local_498->mBones[(long)local_490] = paVar31;
                uVar35 = (local_478->apcOutBones[(long)local_490]->super_aiBone).mName.length;
                if (0x3fe < uVar35) {
                  uVar35 = 0x3ff;
                }
                uVar33 = (ulong)uVar35;
                local_434 = uVar35;
                memcpy(local_430,(local_478->apcOutBones[(long)local_490]->super_aiBone).mName.data,
                       uVar33);
                local_430[uVar33] = 0;
                (paVar31->mName).length = uVar35;
                memcpy(local_440,local_430,uVar33);
                (paVar31->mName).data[uVar33] = '\0';
                pIVar5 = local_478->apcOutBones[(long)ppaVar22];
                fVar18 = (pIVar5->super_aiBone).mOffsetMatrix.a1;
                fVar19 = (pIVar5->super_aiBone).mOffsetMatrix.a2;
                fVar20 = (pIVar5->super_aiBone).mOffsetMatrix.a3;
                fVar21 = (pIVar5->super_aiBone).mOffsetMatrix.a4;
                fVar14 = (pIVar5->super_aiBone).mOffsetMatrix.b1;
                fVar15 = (pIVar5->super_aiBone).mOffsetMatrix.b2;
                fVar16 = (pIVar5->super_aiBone).mOffsetMatrix.b3;
                fVar17 = (pIVar5->super_aiBone).mOffsetMatrix.b4;
                fVar10 = (pIVar5->super_aiBone).mOffsetMatrix.c1;
                fVar11 = (pIVar5->super_aiBone).mOffsetMatrix.c2;
                fVar12 = (pIVar5->super_aiBone).mOffsetMatrix.c3;
                fVar13 = (pIVar5->super_aiBone).mOffsetMatrix.c4;
                fVar7 = (pIVar5->super_aiBone).mOffsetMatrix.d2;
                fVar8 = (pIVar5->super_aiBone).mOffsetMatrix.d3;
                fVar9 = (pIVar5->super_aiBone).mOffsetMatrix.d4;
                (paVar31->mOffsetMatrix).d1 = (pIVar5->super_aiBone).mOffsetMatrix.d1;
                (paVar31->mOffsetMatrix).d2 = fVar7;
                (paVar31->mOffsetMatrix).d3 = fVar8;
                (paVar31->mOffsetMatrix).d4 = fVar9;
                (paVar31->mOffsetMatrix).c1 = fVar10;
                (paVar31->mOffsetMatrix).c2 = fVar11;
                (paVar31->mOffsetMatrix).c3 = fVar12;
                (paVar31->mOffsetMatrix).c4 = fVar13;
                (paVar31->mOffsetMatrix).b1 = fVar14;
                (paVar31->mOffsetMatrix).b2 = fVar15;
                (paVar31->mOffsetMatrix).b3 = fVar16;
                (paVar31->mOffsetMatrix).b4 = fVar17;
                (paVar31->mOffsetMatrix).a1 = fVar18;
                (paVar31->mOffsetMatrix).a2 = fVar19;
                (paVar31->mOffsetMatrix).a3 = fVar20;
                (paVar31->mOffsetMatrix).a4 = fVar21;
                uVar37 = (long)(pvVar34->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar34->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                paVar31->mNumWeights = (uint)uVar37;
                uVar37 = uVar37 & 0xffffffff;
                uVar33 = uVar37 * 8;
                __s = (aiVertexWeight *)operator_new__(uVar33);
                if (uVar37 != 0) {
                  memset(__s,0,uVar33);
                }
                paVar31->mWeights = __s;
                if (paVar31->mNumWeights != 0) {
                  uVar33 = 0;
                  do {
                    paVar31->mWeights[uVar33].mVertexId =
                         (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar33];
                    paVar31->mWeights[uVar33].mWeight = 1.0;
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < paVar31->mNumWeights);
                }
              }
              pvVar34 = pvVar34 + 1;
              local_490 = (aiVector3D **)((long)local_490 + 1);
            } while (pvVar34 !=
                     local_468.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_468);
          uVar33 = local_488;
        }
        this_00 = (vector<aiMesh*,std::allocator<aiMesh*>> *)local_480->avOutList;
        __position._M_current = *(aiMesh ***)(this_00 + 8);
        if (__position._M_current == *(aiMesh ***)(this_00 + 0x10)) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    (this_00,__position,&local_498);
        }
        else {
          *__position._M_current = local_498;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < (ulong)((long)(local_478->pcMats).
                                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_478->pcMats).
                                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void MDLImporter::GenerateOutputMeshes_3DGS_MDL7(
    MDL::IntGroupData_MDL7& groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const MDL::IntSharedData_MDL7& shared = splitGroupData.shared;

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const unsigned int iNumOutBones = pcHeader->bones_num;

    for (std::vector<aiMaterial*>::size_type i = 0; i < shared.pcMats.size();++i)   {
        if (!splitGroupData.aiSplit[i]->empty())    {

            // allocate the output mesh
            aiMesh* pcMesh = new aiMesh();

            pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
            pcMesh->mMaterialIndex = (unsigned int)i;

            // allocate output storage
            pcMesh->mNumFaces = (unsigned int)splitGroupData.aiSplit[i]->size();
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            pcMesh->mNumVertices = pcMesh->mNumFaces*3;
            pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

            if (!groupData.vTextureCoords1.empty()) {
                pcMesh->mNumUVComponents[0] = 2;
                pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
                if (!groupData.vTextureCoords2.empty()) {
                    pcMesh->mNumUVComponents[1] = 2;
                    pcMesh->mTextureCoords[1] = new aiVector3D[pcMesh->mNumVertices];
                }
            }

            // iterate through all faces and build an unique set of vertices
            unsigned int iCurrent = 0;
            for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                pcMesh->mFaces[iFace].mNumIndices = 3;
                pcMesh->mFaces[iFace].mIndices = new unsigned int[3];

                unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                // iterate through all face indices
                for (unsigned int c = 0; c < 3;++c) {
                    const uint32_t iIndex = oldFace.mIndices[c];
                    pcMesh->mVertices[iCurrent] = groupData.vPositions[iIndex];
                    pcMesh->mNormals[iCurrent] = groupData.vNormals[iIndex];

                    if (!groupData.vTextureCoords1.empty()) {

                        pcMesh->mTextureCoords[0][iCurrent] = groupData.vTextureCoords1[iIndex];
                        if (!groupData.vTextureCoords2.empty()) {
                            pcMesh->mTextureCoords[1][iCurrent] = groupData.vTextureCoords2[iIndex];
                        }
                    }
                    pcMesh->mFaces[iFace].mIndices[c] = iCurrent++;
                }
            }

            // if we have bones in the mesh we'll need to generate
            // proper vertex weights for them
            if (!groupData.aiBones.empty()) {
                std::vector<std::vector<unsigned int> > aaiVWeightList;
                aaiVWeightList.resize(iNumOutBones);

                int iCurrent = 0;
                for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                    unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                    const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                    // iterate through all face indices
                    for (unsigned int c = 0; c < 3;++c) {
                        unsigned int iBone = groupData.aiBones[ oldFace.mIndices[c] ];
                        if (UINT_MAX != iBone)  {
                            if (iBone >= iNumOutBones)  {
                                ASSIMP_LOG_ERROR("Bone index overflow. "
                                    "The bone index of a vertex exceeds the allowed range. ");
                                iBone = iNumOutBones-1;
                            }
                            aaiVWeightList[ iBone ].push_back ( iCurrent );
                        }
                        ++iCurrent;
                    }
                }
                // now check which bones are required ...
                for (std::vector<std::vector<unsigned int> >::const_iterator k =  aaiVWeightList.begin();k != aaiVWeightList.end();++k) {
                    if (!(*k).empty()) {
                        ++pcMesh->mNumBones;
                    }
                }
                pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
                iCurrent = 0;
                for (std::vector<std::vector<unsigned int> >::const_iterator k = aaiVWeightList.begin();k!= aaiVWeightList.end();++k,++iCurrent)
                {
                    if ((*k).empty())
                        continue;

                    // seems we'll need this node
                    aiBone* pcBone = pcMesh->mBones[ iCurrent ] = new aiBone();
                    pcBone->mName = aiString(shared.apcOutBones[ iCurrent ]->mName);
                    pcBone->mOffsetMatrix = shared.apcOutBones[ iCurrent ]->mOffsetMatrix;

                    // setup vertex weights
                    pcBone->mNumWeights = (unsigned int)(*k).size();
                    pcBone->mWeights = new aiVertexWeight[pcBone->mNumWeights];

                    for (unsigned int weight = 0; weight < pcBone->mNumWeights;++weight)    {
                        pcBone->mWeights[weight].mVertexId = (*k)[weight];
                        pcBone->mWeights[weight].mWeight = 1.0f;
                    }
                }
            }
            // add the mesh to the list of output meshes
            splitGroupData.avOutList.push_back(pcMesh);
        }
    }
}